

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

bool __thiscall
TypeEnum::getMatches
          (TypeEnum *this,uintb val,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valnames)

{
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  bool bVar6;
  ulong uVar7;
  pointer puVar8;
  bool bVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  
  p_Var1 = &(this->namemap)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = false;
  bVar9 = true;
  while (val == 0) {
    p_Var4 = (this->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        p_Var10 = p_Var4;
        p_Var4 = p_Var10->_M_left;
      } while (p_Var10->_M_left != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 != p_Var1) && (*(long *)(p_Var10 + 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(valnames,(value_type *)&p_Var10[1]._M_parent);
        return bVar6;
      }
    }
LAB_0027361b:
    iVar3 = (this->super_TypeBase).super_Datatype.size;
    if (7 < iVar3) {
      iVar3 = 8;
    }
    val = val ^ uintbmasks[iVar3];
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(valnames);
    bVar6 = true;
    uVar2 = !bVar9;
    bVar9 = false;
    if ((bool)uVar2) {
      return false;
    }
  }
  puVar5 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 == puVar5) {
    return bVar6;
  }
  uVar11 = 0;
  do {
    uVar7 = puVar5[uVar11] & val;
    if (uVar7 != 0) {
      p_Var4 = (this->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var4 == (_Base_ptr)0x0) goto LAB_0027361b;
      do {
        if (*(ulong *)(p_Var4 + 1) >= uVar7) {
          p_Var10 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar7];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
         (uVar7 < ((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_0027361b;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(valnames,(value_type *)((long)p_Var10 + 0x28));
      puVar5 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar8 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    uVar11 = uVar11 + 1;
    if ((ulong)((long)puVar8 - (long)puVar5 >> 3) <= uVar11) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool TypeEnum::getMatches(uintb val,vector<string> &valnames) const

{
  map<uintb,string>::const_iterator iter;
  int4 count;

  for(count=0;count<2;++count) {
    bool allmatch = true;
    if (val == 0) {	// Zero handled specially, it crosses all masks
      iter = namemap.find(val);
      if (iter != namemap.end())
	valnames.push_back( (*iter).second );
      else
	allmatch = false;
    }
    else {
      for(int4 i=0;i<masklist.size();++i) {
	uintb maskedval = val & masklist[i];
	if (maskedval == 0)	// No component of -val- in this mask
	  continue;		// print nothing
	iter = namemap.find(maskedval);
	if (iter != namemap.end())
	  valnames.push_back( (*iter).second );	// Found name for this component
	else {					// If no name for this component
	  allmatch = false;			// Give up on representation
	  break;				// Stop searching for other components
	}
      }
    }
    if (allmatch)			// If we have a complete representation
      return (count==1);		// Return whether we represented original value or complement
    val = val ^ calc_mask(size);	// Switch value we are trying to represent (to complement)
    valnames.clear();			// Clear out old attempt
  }
  return false;	// If we reach here, no representation was possible, -valnames- is empty
}